

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatingpoint_tests.cpp
# Opt level: O0

void __thiscall
floatingpoint_test::iu_FloatingpointTest_x_iutest_x_NINF_Test<double>::Body
          (iu_FloatingpointTest_x_iutest_x_NINF_Test<double> *this)

{
  bool bVar1;
  char *message;
  floating_point<double> *in_R9;
  double dVar2;
  AssertionHelper local_220;
  Fixed local_1e0;
  floating_point<double> local_58;
  floating_point<double> local_50;
  undefined1 local_48 [8];
  AssertionResult iutest_ar;
  TypeParam_conflict b;
  TypeParam_conflict a;
  iu_FloatingpointTest_x_iutest_x_NINF_Test<double> *this_local;
  
  dVar2 = -FloatingpointTest<double>::ONE;
  iutest_ar._32_8_ = FloatingpointTest<double>::ZERO;
  iutest::detail::AlwaysZero();
  iutest::floating_point<double>::floating_point(&local_50,dVar2 / (double)iutest_ar._32_8_);
  iutest::floating_point<double>::NINF();
  iutest::internal::backward::EqHelper<false>::Compare<iutest::floating_point<double>>
            ((AssertionResult *)local_48,(EqHelper<false> *)"FloatType(a/b)","FloatType::NINF()",
             (char *)&local_50,&local_58,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    message = iutest::AssertionResult::message((AssertionResult *)local_48);
    iutest::AssertionHelper::AssertionHelper
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
               ,0x50,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_220,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_220);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  return;
}

Assistant:

IUTEST_TYPED_TEST(FloatingpointTest, NINF)
{
    typedef typename TestFixture::ftype FloatType;
    TypeParam a= - TestFixture::ONE;
    TypeParam b=TestFixture::ZERO;
    IUTEST_EXPECT_EQ(FloatType(a/b), FloatType::NINF());
}